

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O3

Action __thiscall
psy::C::SyntaxDumper::visitPostfixUnaryExpression
          (SyntaxDumper *this,PostfixUnaryExpressionSyntax *node)

{
  SyntaxToken local_50;
  
  traverseExpression(this,(ExpressionSyntax *)node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,node->expr_);
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->oprtrTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,node);
  SyntaxToken::~SyntaxToken(&local_50);
  return Skip;
}

Assistant:

virtual Action visitPostfixUnaryExpression(const PostfixUnaryExpressionSyntax* node) override
    {
        traverseExpression(node);
        nonterminal(node->expression());
        terminal(node->operatorToken(), node);
        return Action::Skip;
    }